

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O1

wb_tree * wb_tree_new(dict_compare_func cmp_func)

{
  wb_tree *pwVar1;
  wb_node *pwVar2;
  
  if (cmp_func != (dict_compare_func)0x0) {
    pwVar1 = (wb_tree *)(*dict_malloc_func)(0x20);
    if (pwVar1 != (wb_tree *)0x0) {
      pwVar1->root = (wb_node *)0x0;
      pwVar1->count = 0;
      pwVar1->cmp_func = cmp_func;
      pwVar1->rotation_count = 0;
    }
    return pwVar1;
  }
  wb_tree_new_cold_1();
  pwVar1 = (wb_tree *)(*dict_malloc_func)(0x10);
  if (pwVar1 != (wb_tree *)0x0) {
    pwVar2 = (wb_node *)wb_tree_new(cmp_func);
    pwVar1->root = pwVar2;
    if (pwVar2 == (wb_node *)0x0) {
      (*dict_free_func)(pwVar1);
      pwVar1 = (wb_tree *)0x0;
    }
    else {
      pwVar1->count = (size_t)&wb_tree_vtable;
    }
  }
  return pwVar1;
}

Assistant:

wb_tree*
wb_tree_new(dict_compare_func cmp_func)
{
    ASSERT(cmp_func != NULL);

    wb_tree* tree = MALLOC(sizeof(*tree));
    if (tree) {
	tree->root = NULL;
	tree->count = 0;
	tree->cmp_func = cmp_func;
	tree->rotation_count = 0;
    }
    return tree;
}